

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedStorage.h
# Opt level: O0

void __thiscall
Eigen::internal::CompressedStorage<double,_int>::resize
          (CompressedStorage<double,_int> *this,Index size,double reserveSizeFactor)

{
  int iVar1;
  long *plVar2;
  long in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  Index realloc_size;
  Index in_stack_00000048;
  CompressedStorage<double,_int> *in_stack_00000050;
  long local_30;
  long local_28;
  long local_20;
  double local_18;
  long local_10;
  
  local_10 = in_RSI;
  if (*(long *)(in_RDI + 0x18) < in_RSI) {
    local_18 = in_XMM0_Qa;
    iVar1 = GenericNumTraits<int>::highest();
    local_28 = (long)iVar1;
    local_30 = local_10 + (long)(local_18 * (double)local_10);
    plVar2 = std::min<long>(&local_28,&local_30);
    local_20 = *plVar2;
    if (local_20 < local_10) {
      throw_std_bad_alloc();
    }
    reallocate(in_stack_00000050,in_stack_00000048);
  }
  *(long *)(in_RDI + 0x10) = local_10;
  return;
}

Assistant:

void resize(Index size, double reserveSizeFactor = 0)
    {
      if (m_allocatedSize<size)
      {
        Index realloc_size = (std::min<Index>)(NumTraits<StorageIndex>::highest(),  size + Index(reserveSizeFactor*double(size)));
        if(realloc_size<size)
          internal::throw_std_bad_alloc();
        reallocate(realloc_size);
      }
      m_size = size;
    }